

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpIf::parse(CTcPrsOpIf *this)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcPrsNode *pCVar4;
  CTcPrsNode *third;
  CTcPrsNode *second;
  CTcPrsNode *first;
  undefined8 in_stack_ffffffffffffffb8;
  CTcParser *in_stack_ffffffffffffffc0;
  CTcTokenizer *in_stack_ffffffffffffffc8;
  CTPNIf *in_stack_ffffffffffffffd0;
  CTcPrsOpIfnil *in_stack_ffffffffffffffe8;
  CTcPrsNode *local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = CTcPrsOpIfnil::parse(in_stack_ffffffffffffffe8);
  if (local_8 == (CTcPrsNode *)0x0) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2a75cf);
    if (tVar1 == TOKT_QUESTION) {
      CTcTokenizer::next(in_stack_ffffffffffffffc8);
      pCVar3 = CTcParser::parse_expr_or_dstr(in_stack_ffffffffffffffc0,iVar2);
      if (pCVar3 == (CTcPrsNode *)0x0) {
        local_8 = (CTcPrsNode *)0x0;
      }
      else {
        tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2a7630);
        if (tVar1 != TOKT_COLON) {
          CTcTokenizer::log_error(0x2afd);
          tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2a7650);
          if (tVar1 == TOKT_EOF) {
            return (CTcPrsNode *)0x0;
          }
        }
        CTcTokenizer::next(in_stack_ffffffffffffffc8);
        pCVar4 = CTcParser::parse_expr_or_dstr(in_stack_ffffffffffffffc0,iVar2);
        if (pCVar4 == (CTcPrsNode *)0x0) {
          local_8 = (CTcPrsNode *)0x0;
        }
        else {
          iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a76aa);
          if (iVar2 == 0) {
            local_8 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a76f3);
            CTPNIf::CTPNIf(in_stack_ffffffffffffffd0,(CTcPrsNode *)in_stack_ffffffffffffffc8,
                           (CTcPrsNode *)in_stack_ffffffffffffffc0,local_8);
          }
          else {
            (*(local_8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
            iVar2 = CTcConstVal::get_val_bool((CTcConstVal *)in_stack_ffffffffffffffc0);
            local_8 = pCVar4;
            if (iVar2 != 0) {
              local_8 = pCVar3;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpIf::parse() const
{
    /* parse the conditional part */
    CTcPrsNode *first = S_op_ifnil.parse();
    if (first == 0)
        return 0;

    /* if we're not looking at the '?' operator, we're done */
    if (G_tok->cur() != TOKT_QUESTION)
        return first;

    /* skip the '?' operator */
    G_tok->next();

    /* 
     *   parse the second part, which can be any expression, including a
     *   double-quoted string expression or a comma expression (even though
     *   the '?:' operator overall has higher precedence than ',', we can't
     *   steal away operands from a ',' before our ':' because that would
     *   leave the ':' with nothing to go with) 
     */
    CTcPrsNode *second = G_prs->parse_expr_or_dstr(TRUE);
    if (second == 0)
        return 0;
    
    /* make sure we have the ':' after the second part */
    if (G_tok->cur() != TOKT_COLON)
    {
        /* 
         *   log the error, but continue parsing as though we found the
         *   ':' - if the ':' is simply missing, this will allow us to
         *   recover and continue parsing the rest of the expression 
         */
        G_tok->log_error(TCERR_QUEST_WITHOUT_COLON);

        /* if we're at the end of file, there's no point in continuing */
        if (G_tok->cur() == TOKT_EOF)
            return 0;
    }
    
    /* skip the ':' */
    G_tok->next();
    
    /* 
     *   parse the third part, which can be any other expression, including a
     *   double-quoted string expression - but not a comma expression, since
     *   we have higher precedence than ',' 
     */
    CTcPrsNode *third = G_prs->parse_expr_or_dstr(FALSE);
    if (third == 0)
        return 0;
        
    /* 
     *   If the condition is constant, we can choose the second or third
     *   expression directly.  It doesn't matter whether or not the second
     *   and/or third parts are themselves constant, because a constant
     *   condition means that we'll always execute only one of the
     *   alternatives.  
     */
    if (first->is_const())
    {
        /* 
         *   evaluate the conditional value as a true/false value, and
         *   return the second part's constant if the condition is true,
         *   or the third part's constant if the condition is false 
         */
        return (first->get_const_val()->get_val_bool()
                ? second : third);
    }
    else
    {
        /* it's not a constant value - return a new conditional node */
        return new CTPNIf(first, second, third);
    }
}